

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

int Abc_StringGetNumber(char **ppStr)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)*ppStr;
  bVar2 = *pbVar4;
  if ((byte)(bVar2 - 0x30) < 10) {
    iVar3 = 0;
    while ((byte)(bVar2 - 0x30) < 10) {
      iVar3 = iVar3 * 10 + (uint)bVar2 + -0x30;
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar2 = *pbVar1;
    }
    *ppStr = (char *)pbVar4;
    return iVar3;
  }
  __assert_fail("*pStr >= \'0\' && *pStr <= \'9\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                ,0x7d,"int Abc_StringGetNumber(char **)");
}

Assistant:

static inline int Abc_StringGetNumber( char ** ppStr )
{
    char * pStr = *ppStr;
    int Number = 0;
    assert( *pStr >= '0' && *pStr <= '9' );
    for ( ; *pStr >= '0' && *pStr <= '9'; pStr++ )
        Number = 10 * Number + *pStr - '0';
    *ppStr = pStr;
    return Number;
}